

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O0

bool __thiscall
cmVariableWatch::VariableAccessed
          (cmVariableWatch *this,string *variable,int access_type,char *newValue,cmMakefile *mf)

{
  bool bVar1;
  pointer ppVar2;
  value_type *ppPVar3;
  const_reference ppPVar4;
  value_type *cbData;
  size_t i;
  const_iterator it;
  VectorOfPairs *vp;
  _Self local_40;
  const_iterator mit;
  cmMakefile *mf_local;
  char *newValue_local;
  int access_type_local;
  string *variable_local;
  cmVariableWatch *this_local;
  
  mit._M_node = (_Base_ptr)mf;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
       ::find(&this->WatchMap,variable);
  vp = (VectorOfPairs *)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
       ::end(&this->WatchMap);
  bVar1 = std::operator!=(&local_40,(_Self *)&vp);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>
             ::operator->(&local_40);
    it._M_current = (Pair **)&ppVar2->second;
    __gnu_cxx::
    __normal_iterator<cmVariableWatch::Pair_*const_*,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>
    ::__normal_iterator((__normal_iterator<cmVariableWatch::Pair_*const_*,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>
                         *)&i);
    cbData = (value_type *)0x0;
    while( true ) {
      ppPVar3 = (value_type *)
                std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>::size
                          ((vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>
                            *)it._M_current);
      if (ppPVar3 <= cbData) break;
      ppPVar4 = std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>::
                operator[]((vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>
                            *)it._M_current,(size_type)cbData);
      (*(*ppPVar4)->Method)
                (variable,access_type,(*ppPVar4)->ClientData,newValue,(cmMakefile *)mit._M_node);
      cbData = (value_type *)((long)cbData + 1);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmVariableWatch::VariableAccessed(const std::string& variable,
                                       int access_type, const char* newValue,
                                       const cmMakefile* mf) const
{
  cmVariableWatch::StringToVectorOfPairs::const_iterator mit =
    this->WatchMap.find(variable);
  if (mit != this->WatchMap.end()) {
    const cmVariableWatch::VectorOfPairs* vp = &mit->second;
    cmVariableWatch::VectorOfPairs::const_iterator it;
    for (size_t i = 0; i < vp->size(); i++) {
      auto& cbData = (*vp)[i];
      cbData->Method(variable, access_type, cbData->ClientData, newValue, mf);
    }
    return true;
  }
  return false;
}